

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

void flatbuffers::AppendTextWrappedString
               (stringstream *ss,string *text,size_t max_col,size_t start_col)

{
  ulong uVar1;
  ostream *poVar2;
  size_t start_col_00;
  string rest_of_description;
  
  if (text->_M_string_length <= 0x50 - max_col) {
    std::operator<<((ostream *)(ss + 0x10),(string *)text);
    return;
  }
  uVar1 = std::__cxx11::string::rfind((char)text,0x20);
  std::__cxx11::string::substr((ulong)&rest_of_description,(ulong)text);
  poVar2 = std::operator<<((ostream *)(ss + 0x10),(string *)&rest_of_description);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&rest_of_description);
  rest_of_description._M_dataplus._M_p = (pointer)&rest_of_description.field_2;
  std::__cxx11::string::_M_construct((ulong)&rest_of_description,(char)max_col);
  std::operator<<((ostream *)(ss + 0x10),(string *)&rest_of_description);
  std::__cxx11::string::~string((string *)&rest_of_description);
  if (0x50 - max_col <= uVar1) {
    std::__cxx11::string::at((ulong)text);
  }
  start_col_00 = 0xffffffffffffffff;
  std::__cxx11::string::substr((ulong)&rest_of_description,(ulong)text);
  AppendTextWrappedString(ss,&rest_of_description,max_col,start_col_00);
  std::__cxx11::string::~string((string *)&rest_of_description);
  return;
}

Assistant:

static void AppendTextWrappedString(std::stringstream &ss, std::string &text,
                                    size_t max_col, size_t start_col) {
  size_t max_line_length = max_col - start_col;

  if (text.length() > max_line_length) {
    size_t ideal_break_location = text.rfind(' ', max_line_length);
    size_t length = std::min(max_line_length, ideal_break_location);
    ss << text.substr(0, length) << "\n";
    ss << std::string(start_col, ' ');
    std::string rest_of_description = text.substr(
        ((ideal_break_location < max_line_length || text.at(length) == ' ')
             ? length + 1
             : length));
    AppendTextWrappedString(ss, rest_of_description, max_col, start_col);
  } else {
    ss << text;
  }
}